

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O3

ENetPacket * enet_packet_create(void *data,size_t dataLength,uint32_t flags)

{
  ENetPacket *pEVar1;
  
  if ((flags & 4) == 0) {
    pEVar1 = (ENetPacket *)(*(code *)callbacks_0)(dataLength + 0x28);
    if (pEVar1 == (ENetPacket *)0x0) {
LAB_00103669:
      pEVar1 = (ENetPacket *)(*(code *)callbacks_2)();
      return pEVar1;
    }
    pEVar1->data = (uint8_t *)(pEVar1 + 1);
    if (data != (void *)0x0) {
      memcpy(pEVar1 + 1,data,dataLength);
    }
  }
  else {
    pEVar1 = (ENetPacket *)(*(code *)callbacks_0)(0x28);
    if (pEVar1 == (ENetPacket *)0x0) goto LAB_00103669;
    pEVar1->data = (uint8_t *)data;
  }
  pEVar1->referenceCount = 0;
  pEVar1->flags = flags;
  pEVar1->dataLength = (uint32_t)dataLength;
  pEVar1->freeCallback = (ENetPacketFreeCallback)0x0;
  pEVar1->userData = (void *)0x0;
  return pEVar1;
}

Assistant:

ENetPacket* enet_packet_create(const void* data, size_t dataLength, uint32_t flags) {
	ENetPacket* packet;

	if (flags & ENET_PACKET_FLAG_NO_ALLOCATE) {
		packet = (ENetPacket*)enet_malloc(sizeof(ENetPacket));

		if (packet == NULL)
			return NULL;

		packet->data = (uint8_t*)data;
	}
	else {
		packet = (ENetPacket*)enet_malloc(sizeof(ENetPacket) + dataLength);

		if (packet == NULL)
			return NULL;

		packet->data = (uint8_t*)packet + sizeof(ENetPacket);

		if (data != NULL)
			memcpy(packet->data, data, dataLength);
	}

	packet->referenceCount = 0;
	packet->flags = flags;
	packet->dataLength = dataLength;
	packet->freeCallback = NULL;
	packet->userData = NULL;

	return packet;
}